

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_splitor.cc
# Opt level: O3

void __thiscall xLearn::FileSpliter::split(FileSpliter *this,string *filename,int num_blocks)

{
  long lVar1;
  size_t sVar2;
  int iVar3;
  FILE *pFVar4;
  void *__dest;
  size_t sVar5;
  string *psVar6;
  ostream *poVar7;
  Logger *this_00;
  size_t sVar8;
  long __length;
  ulong uVar9;
  string name;
  string local_c8;
  string local_a8;
  string *local_88;
  Logger local_7c;
  void *local_78;
  _Alloc_hider local_70;
  string local_60;
  void *local_40;
  ulong local_38;
  
  local_88 = filename;
  if (filename->_M_string_length == 0) {
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    local_70._M_p._0_4_ = 2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/reader/file_splitor.cc"
               ,"");
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"split","");
    poVar7 = Logger::Start(ERR,&local_c8,0x29,&local_a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"CHECK_NE failed ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/reader/file_splitor.cc"
               ,99);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x29);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"filename.empty()",0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," = ",3);
    poVar7 = std::ostream::_M_insert<bool>(SUB81(poVar7,0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"true",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," = ",3);
    poVar7 = std::ostream::_M_insert<bool>(SUB81(poVar7,0));
    std::operator<<(poVar7,"\n");
  }
  else if (num_blocks < 2) {
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    local_70._M_p._0_4_ = 2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/reader/file_splitor.cc"
               ,"");
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"split","");
    poVar7 = Logger::Start(ERR,&local_c8,0x2a,&local_a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"CHECK_GE failed ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/reader/file_splitor.cc"
               ,99);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x2a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"num_blocks",10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," = ",3);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,num_blocks);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"2",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," = ",3);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,2);
    std::operator<<(poVar7,"\n");
  }
  else {
    pFVar4 = (FILE *)OpenFileOrDie((filename->_M_dataplus)._M_p,"r");
    iVar3 = fileno(pFVar4);
    local_78 = (void *)CONCAT44(local_78._4_4_,iVar3);
    local_60.field_2._M_allocated_capacity = GetFileSize((FILE *)pFVar4);
    local_60.field_2._8_8_ = ZEXT48((uint)num_blocks);
    local_38 = local_60.field_2._M_allocated_capacity / (ulong)local_60.field_2._8_8_;
    sVar8 = (local_60.field_2._M_allocated_capacity + local_38) - local_38 * local_60.field_2._8_8_;
    local_40 = operator_new__(local_60.field_2._8_8_ * 4);
    uVar9 = 0;
    do {
      StringPrintf_abi_cxx11_(&local_c8,"%s_%d",(local_88->_M_dataplus)._M_p,uVar9 & 0xffffffff);
      pFVar4 = (FILE *)OpenFileOrDie(local_c8._M_dataplus._M_p,"w+");
      iVar3 = fileno(pFVar4);
      *(int *)((long)local_40 + uVar9 * 4) = iVar3;
      iVar3 = ftruncate(iVar3,sVar8 + 0xa00000);
      if (iVar3 != 0) {
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        local_7c.severity_ = ERR;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/reader/file_splitor.cc"
                   ,"");
        local_70._M_p = (pointer)&local_60;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"split","");
        poVar7 = Logger::Start(ERR,&local_a8,0x45,(string *)&local_70);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"CHECK_EQ failed ",0x10);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/reader/file_splitor.cc"
                   ,99);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,":",1);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x45);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"ret",3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," = ",3);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,iVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"0",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," = ",3);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0);
        std::operator<<(poVar7,"\n");
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_a8);
        this_00 = &local_7c;
        goto LAB_00139c9f;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p);
      }
      uVar9 = uVar9 + 1;
    } while (local_60.field_2._8_8_ != uVar9);
    local_78 = mmap((void *)0x0,local_60.field_2._0_8_,1,2,(int)local_78,0);
    if (local_78 == (void *)0xffffffffffffffff) {
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      local_70._M_p._0_4_ = 2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/reader/file_splitor.cc"
                 ,"");
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"split","");
      poVar7 = Logger::Start(ERR,&local_c8,0x4d,&local_a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"CHECK_NE failed ",0x10);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/reader/file_splitor.cc"
                 ,99);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,":",1);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x4d);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"map_ptr_read",0xc);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," = ",3);
      sVar8 = strlen((char *)0xffffffffffffffff);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)0xffffffffffffffff,sVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"MAP_FAILED",10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," = ",3);
      poVar7 = std::ostream::_M_insert<void_const*>(poVar7);
      std::operator<<(poVar7,"\n");
    }
    else {
      uVar9 = 0;
      psVar6 = (string *)0x0;
      while( true ) {
        iVar3 = *(int *)((long)local_40 + uVar9 * 4);
        __dest = mmap((void *)0x0,sVar8,2,1,iVar3,0);
        if (__dest == (void *)0xffffffffffffffff) {
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          local_70._M_p._0_4_ = 2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c8,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/reader/file_splitor.cc"
                     ,"");
          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"split","");
          poVar7 = Logger::Start(ERR,&local_c8,0x56,&local_a8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"CHECK_NE failed ",0x10);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/reader/file_splitor.cc"
                     ,99);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,":",1);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x56);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"map_ptr_write",0xd);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," = ",3);
          sVar8 = strlen((char *)0xffffffffffffffff);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,(char *)0xffffffffffffffff,sVar8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"MAP_FAILED",10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," = ",3);
          poVar7 = std::ostream::_M_insert<void_const*>(poVar7);
          std::operator<<(poVar7,"\n");
          goto LAB_00139c88;
        }
        local_88 = psVar6;
        memcpy(__dest,(void *)((long)local_78 + (long)psVar6),sVar8);
        __length = sVar8 + 1;
        sVar2 = sVar8;
        do {
          sVar5 = sVar2;
          lVar1 = __length + -2;
          __length = __length + -1;
          sVar2 = sVar5 - 1;
        } while (*(char *)((long)__dest + lVar1) != '\n');
        munmap(__dest,sVar8);
        iVar3 = ftruncate(iVar3,__length);
        if (iVar3 != 0) break;
        uVar9 = uVar9 + 1;
        psVar6 = (string *)((long)local_88 + __length);
        sVar8 = (sVar8 + local_38) - sVar5;
        if (uVar9 == local_60.field_2._8_8_) {
          munmap(local_78,local_60.field_2._0_8_);
          return;
        }
      }
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      local_70._M_p._0_4_ = 2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/reader/file_splitor.cc"
                 ,"");
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"split","");
      poVar7 = Logger::Start(ERR,&local_c8,0x5e,&local_a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"CHECK_EQ failed ",0x10);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/reader/file_splitor.cc"
                 ,99);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,":",1);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x5e);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"ret",3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," = ",3);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,iVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"0",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," = ",3);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0);
      std::operator<<(poVar7,"\n");
    }
  }
LAB_00139c88:
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  this_00 = (Logger *)&local_70;
LAB_00139c9f:
  Logger::~Logger(this_00);
  abort();
}

Assistant:

void FileSpliter::split(const std::string& filename, int num_blocks) {
  CHECK_NE(filename.empty(), true);
  CHECK_GE(num_blocks, 2); // At least we need two blocks for CV.
  // Input
#ifndef _MSC_VER
  FILE* file_ptr_read = OpenFileOrDie(filename.c_str(), "r");
#else
  FILE* file_ptr_read = OpenFileOrDie(filename.c_str(), "rb");
#endif
  int file_desc_read = fileno(file_ptr_read);
  uint64 file_size = GetFileSize(file_ptr_read);
  uint64 average_block_size = file_size / num_blocks;
  uint64 next_block_size = average_block_size +
      file_size - (average_block_size * num_blocks);
  uint64 offset = 0;
  // Output
  FILE** file_ptr_write = new FILE* [num_blocks];
  int* file_desc_write = new int [num_blocks];

  for (int i = 0; i < num_blocks; ++i) {
    std::string name = StringPrintf("%s_%d", filename.c_str(), i);
#ifndef _MSC_VER
    file_ptr_write[i] = OpenFileOrDie(name.c_str(), "w+");
#else
    file_ptr_write[i] = OpenFileOrDie(name.c_str(), "wb+");
#endif
    file_desc_write[i] = fileno(file_ptr_write[i]);
    int ret = ftruncate(file_desc_write[i], 
      next_block_size + kMaxLineSize);
    CHECK_EQ(ret, 0);
  }
  char* map_ptr_read = (char*)mmap(NULL,
                                   file_size,
                                   PROT_READ,
                                   MAP_PRIVATE,
                                   file_desc_read,
                                   0);
  CHECK_NE(map_ptr_read, MAP_FAILED);

  for (int i = 0; i < num_blocks; ++i) {
    char* map_ptr_write = (char *)mmap(NULL,
                                       next_block_size,
                                       PROT_WRITE,
                                       MAP_SHARED,
                                       file_desc_write[i],
                                       0);
    CHECK_NE(map_ptr_write, MAP_FAILED);
    uint64 real_file_size = next_block_size;
    memcpy(map_ptr_write, map_ptr_read+offset, real_file_size);
    while (map_ptr_write[real_file_size-1] != '\n') {
      real_file_size--;
    }
    munmap(map_ptr_write, next_block_size);
    int ret = ftruncate(file_desc_write[i], real_file_size);
    CHECK_EQ(ret, 0);
    next_block_size =
        average_block_size + (next_block_size - real_file_size);
    offset += real_file_size;
#ifdef _MSC_VER
  Close(file_ptr_write[i]);
#endif
  }
  munmap(map_ptr_read, file_size);
#ifdef _MSC_VER
  Close(file_ptr_read);
#endif
}